

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow.c
# Opt level: O3

void dmrC_check_access(dmr_C *C,instruction *insn)

{
  uint uVar1;
  basic_block *pbVar2;
  basic_block_list *pbVar3;
  int iVar4;
  undefined8 in_RAX;
  undefined4 uVar6;
  char *pcVar5;
  char *pcVar7;
  
  uVar6 = (undefined4)((ulong)in_RAX >> 0x20);
  if ((insn->bb != (basic_block *)0x0) &&
     (pbVar2 = (insn->field_6).field_1.bb_true, *(int *)&(pbVar2->pos).field_0x4 == 2)) {
    pbVar3 = pbVar2->parents;
    if (0 < *(int *)(pbVar3->list_ + 6)) {
      uVar1 = (insn->field_6).field_5.offset;
      if ((int)uVar1 < 0) {
        pcVar7 = "below";
      }
      else {
        if ((int)((*(uint *)insn >> 8) + C->target->bits_in_char * uVar1) <=
            *(int *)(pbVar3->list_ + 6)) {
          return;
        }
        pcVar7 = "past the end of";
      }
      pcVar5 = dmrC_show_ident(C,(ident *)pbVar3->allocator_);
      if (*(int *)(pbVar3->list_ + 6) < 0) {
        iVar4 = -1;
      }
      else {
        iVar4 = C->target->bits_in_char;
        iVar4 = (*(int *)(pbVar3->list_ + 6) + iVar4 + -1) / iVar4;
      }
      dmrC_warning(C,insn->pos,"invalid access %s \'%s\' (%d %d)",pcVar7,pcVar5,(ulong)uVar1,
                   CONCAT44(uVar6,iVar4));
    }
  }
  return;
}

Assistant:

void dmrC_check_access(struct dmr_C *C, struct instruction *insn)
{
	pseudo_t pseudo = insn->src;

	if (insn->bb && pseudo->type == PSEUDO_SYM) {
		int offset = insn->offset, bit = dmrC_bytes_to_bits(C->target, offset) + insn->size;
		struct symbol *sym = pseudo->sym;

		if (sym->bit_size > 0 && (offset < 0 || bit > sym->bit_size))
			dmrC_warning(C, insn->pos, "invalid access %s '%s' (%d %d)",
				offset < 0 ? "below" : "past the end of",
				dmrC_show_ident(C, sym->ident), offset,
				dmrC_bits_to_bytes(C->target, sym->bit_size));
	}
}